

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

JObject * __thiscall
pstack::JObject::field<char[8],td_thr_type_e,char>
          (JObject *this,char (*k) [8],td_thr_type_e *v,char *c)

{
  ostream *os;
  JSON<pstack::Field<char[8],_td_thr_type_e>,_char> local_48;
  undefined1 local_38 [8];
  Field<char[8],_td_thr_type_e> field;
  char *c_local;
  td_thr_type_e *v_local;
  char (*k_local) [8];
  JObject *this_local;
  
  field.v = (td_thr_type_e *)c;
  Field<char[8],_td_thr_type_e>::Field((Field<char[8],_td_thr_type_e> *)local_38,k,v);
  os = std::operator<<(this->os,this->sep);
  local_48 = json<pstack::Field<char[8],td_thr_type_e>,char>
                       ((Field<char[8],_td_thr_type_e> *)local_38,(char *)field.v);
  pstack::operator<<(os,&local_48);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }